

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float32 float32_sub_m68k(float32 a,float32 b,float_status *s)

{
  float32 fVar1;
  union_float32 ub;
  ulong uVar2;
  union_float32 ua;
  ulong uVar3;
  float fVar4;
  
  uVar3 = (ulong)a;
  uVar2 = (ulong)b;
  if (((s->float_exception_flags & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      if ((a & 0x7fffffff) != 0 && (a & 0x7f800000) == 0) {
        uVar3 = (ulong)(a & 0x80000000);
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
      if ((b & 0x7fffffff) != 0 && (b & 0x7f800000) == 0) {
        uVar2 = (ulong)(b & 0x80000000);
        s->float_exception_flags = s->float_exception_flags | 0x40;
      }
    }
    b = (float32)uVar2;
    a = (float32)uVar3;
    if ((((uVar3 & 0x7fffffff) == 0) || (((int)(uVar3 >> 0x17) + 1U & 0xfe) != 0)) &&
       (((uVar2 & 0x7fffffff) == 0 || (((int)(uVar2 >> 0x17) + 1U & 0xfe) != 0)))) {
      fVar4 = (float)a - (float)b;
      if (ABS(fVar4) == INFINITY) {
        s->float_exception_flags = s->float_exception_flags | 8;
        return (float32)fVar4;
      }
      if ((1.1754944e-38 < ABS(fVar4)) || (((b | a) & 0x7fffffff) == 0)) {
        return (float32)fVar4;
      }
    }
  }
  fVar1 = soft_f32_addsub(a,b,true,s);
  return fVar1;
}

Assistant:

float32 QEMU_FLATTEN
float32_sub(float32 a, float32 b, float_status *s)
{
    return float32_addsub(a, b, s, hard_f32_sub, soft_f32_sub);
}